

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type
pugi::impl::anon_unknown_0::utf16_decoder<pugi::impl::(anonymous_namespace)::opt_true>::
process<pugi::impl::(anonymous_namespace)::utf8_writer>
          (size_t data,value_type size,value_type result)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t next;
  value_type puStack_28;
  uint16_t lead;
  value_type result_local;
  size_t size_local;
  uint16_t *data_local;
  
  puStack_28 = result;
  result_local = size;
  size_local = data;
  while (result_local != (value_type)0x0) {
    uVar1 = endian_swap(*(uint16_t *)size_local);
    if (uVar1 < 0xd800) {
      puStack_28 = utf8_writer::low(puStack_28,(uint)uVar1);
      size_local = size_local + 2;
      result_local = result_local + -1;
    }
    else if (uVar1 - 0xe000 < 0x2000) {
      puStack_28 = utf8_writer::low(puStack_28,(uint)uVar1);
      size_local = size_local + 2;
      result_local = result_local + -1;
    }
    else if ((uVar1 - 0xd800 < 0x400) && ((value_type)0x1 < result_local)) {
      uVar2 = endian_swap(*(uint16_t *)(size_local + 2));
      if (uVar2 - 0xdc00 < 0x400) {
        puStack_28 = utf8_writer::high(puStack_28,
                                       (uVar1 & 0x3ff) * 0x400 + 0x10000 + (uVar2 & 0x3ff));
        size_local = size_local + 4;
        result_local = result_local + -2;
      }
      else {
        size_local = size_local + 2;
        result_local = result_local + -1;
      }
    }
    else {
      size_local = size_local + 2;
      result_local = result_local + -1;
    }
  }
  return puStack_28;
}

Assistant:

static inline typename Traits::value_type process(const uint16_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				uint16_t lead = opt_swap::value ? endian_swap(*data) : *data;

				// U+0000..U+D7FF
				if (lead < 0xD800)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// U+E000..U+FFFF
				else if (static_cast<unsigned int>(lead - 0xE000) < 0x2000)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// surrogate pair lead
				else if (static_cast<unsigned int>(lead - 0xD800) < 0x400 && size >= 2)
				{
					uint16_t next = opt_swap::value ? endian_swap(data[1]) : data[1];

					if (static_cast<unsigned int>(next - 0xDC00) < 0x400)
					{
						result = Traits::high(result, 0x10000 + ((lead & 0x3ff) << 10) + (next & 0x3ff));
						data += 2;
						size -= 2;
					}
					else
					{
						data += 1;
						size -= 1;
					}
				}
				else
				{
					data += 1;
					size -= 1;
				}
			}

			return result;
		}